

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O0

Maybe<kj::ArrayPtr<const_char>_> *
kj::anon_unknown_0::trySplit
          (Maybe<kj::ArrayPtr<const_char>_> *__return_storage_ptr__,ArrayPtr<const_char> *text,
          char c)

{
  bool bVar1;
  unsigned_long *puVar2;
  char *pcVar3;
  size_t start;
  size_t end;
  ArrayPtr<const_char> AVar4;
  char *local_70;
  size_t local_68;
  undefined1 local_60 [8];
  ArrayPtr<const_char> result;
  unsigned_long i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_long> *__range2;
  char c_local;
  ArrayPtr<const_char> *text_local;
  
  ___begin2 = indices<kj::ArrayPtr<char_const>&>(text);
  __end2 = Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin2);
  i = (unsigned_long)Range<unsigned_long>::end((Range<unsigned_long> *)&__begin2);
  while( true ) {
    bVar1 = Range<unsigned_long>::Iterator::operator==(&__end2,(Iterator *)&i);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      Maybe<kj::ArrayPtr<const_char>_>::Maybe(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    puVar2 = Range<unsigned_long>::Iterator::operator*(&__end2);
    result.size_ = *puVar2;
    pcVar3 = ArrayPtr<const_char>::operator[](text,result.size_);
    if (*pcVar3 == c) break;
    Range<unsigned_long>::Iterator::operator++(&__end2);
  }
  _local_60 = ArrayPtr<const_char>::first(text,result.size_);
  start = result.size_ + 1;
  end = ArrayPtr<const_char>::size(text);
  AVar4 = ArrayPtr<const_char>::slice(text,start,end);
  local_70 = AVar4.ptr;
  text->ptr = local_70;
  local_68 = AVar4.size_;
  text->size_ = local_68;
  Maybe<kj::ArrayPtr<const_char>_>::Maybe(__return_storage_ptr__,(ArrayPtr<const_char> *)local_60);
  return __return_storage_ptr__;
}

Assistant:

Maybe<ArrayPtr<const char>> trySplit(ArrayPtr<const char>& text, char c) {
  for (auto i: kj::indices(text)) {
    if (text[i] == c) {
      ArrayPtr<const char> result = text.first(i);
      text = text.slice(i + 1, text.size());
      return result;
    }
  }
  return kj::none;
}